

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.cpp
# Opt level: O3

void __thiscall
Peers::peerIsConnected(Peers *this,unique_ptr<Peer,_std::default_delete<Peer>_> *peer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer __p;
  long lVar3;
  pointer piVar4;
  pointer piVar5;
  uint16_t uVar6;
  ulong uVar7;
  int *piVar8;
  mapped_type *this_00;
  Events *this_01;
  unique_ptr<Event,_std::default_delete<Event>_> *puVar9;
  __uniq_ptr_impl<Peer,_std::default_delete<Peer>_> *this_02;
  int iVar10;
  int *piVar11;
  int *piVar12;
  vector<int,_std::allocator<int>_> ipPeers;
  vector<int,_std::allocator<int>_> local_60;
  string local_48;
  
  Peer::ip_abi_cxx11_(&local_48,
                      (peer->_M_t).super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
                      super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
                      super__Head_base<0UL,_Peer_*,_false>._M_head_impl);
  ip2Peers(&local_60,this,&local_48);
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_48._M_dataplus._M_p._4_4_,(uint)local_48._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT44(local_48._M_dataplus._M_p._4_4_,(uint)local_48._M_dataplus._M_p),
                    local_48.field_2._M_allocated_capacity + 1);
  }
  uVar6 = Peer::port((peer->_M_t).super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
                     super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
                     super__Head_base<0UL,_Peer_*,_false>._M_head_impl);
  local_48._M_dataplus._M_p._0_4_ = (uint)uVar6;
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_60,
               (iterator)
               local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_48);
  }
  else {
    *local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = (uint)local_48._M_dataplus._M_p;
    local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish + 1;
  }
  piVar5 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar4 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar7 = (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar3 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar4,piVar5);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar11 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start + 1;
    do {
      piVar12 = piVar11;
      if (piVar12 ==
          local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) goto LAB_0010b22c;
      piVar11 = piVar12 + 1;
    } while (piVar12[-1] != *piVar12);
    piVar8 = piVar12 + -1;
    iVar10 = piVar12[-1];
    for (; piVar11 !=
           local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish; piVar11 = piVar11 + 1) {
      iVar2 = *piVar11;
      if (iVar10 != iVar2) {
        piVar8[1] = iVar2;
        piVar8 = piVar8 + 1;
      }
      iVar10 = iVar2;
    }
    if (piVar8 + 1 !=
        local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar8 + 1;
    }
  }
LAB_0010b22c:
  Peer::ip_abi_cxx11_(&local_48,
                      (peer->_M_t).super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
                      super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
                      super__Head_base<0UL,_Peer_*,_false>._M_head_impl);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::operator[](&this->m_ip2PeerMap,&local_48);
  std::vector<int,_std::allocator<int>_>::operator=(this_00,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_48._M_dataplus._M_p._4_4_,(uint)local_48._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT44(local_48._M_dataplus._M_p._4_4_,(uint)local_48._M_dataplus._M_p),
                    local_48.field_2._M_allocated_capacity + 1);
  }
  this_01 = P2PSocket::events(this->m_p2pSocket);
  puVar9 = Events::onPeerConnect(this_01);
  Event::trigger<Peer*>
            ((puVar9->_M_t).super___uniq_ptr_impl<Event,_std::default_delete<Event>_>._M_t.
             super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
             super__Head_base<0UL,_Event_*,_false>._M_head_impl,
             (peer->_M_t).super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
             super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
             super__Head_base<0UL,_Peer_*,_false>._M_head_impl);
  Peer::name_abi_cxx11_
            (&local_48,
             (peer->_M_t).super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
             super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
             super__Head_base<0UL,_Peer_*,_false>._M_head_impl);
  this_02 = (__uniq_ptr_impl<Peer,_std::default_delete<Peer>_> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>_>
            ::operator[](&this->m_peers,&local_48);
  __p = (peer->_M_t).super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
        super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
        super__Head_base<0UL,_Peer_*,_false>._M_head_impl;
  (peer->_M_t).super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
  super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.super__Head_base<0UL,_Peer_*,_false>.
  _M_head_impl = (Peer *)0x0;
  std::__uniq_ptr_impl<Peer,_std::default_delete<Peer>_>::reset(this_02,__p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_48._M_dataplus._M_p._4_4_,(uint)local_48._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT44(local_48._M_dataplus._M_p._4_4_,(uint)local_48._M_dataplus._M_p),
                    local_48.field_2._M_allocated_capacity + 1);
  }
  this->m_count = this->m_count + 1;
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Peers::peerIsConnected(std::unique_ptr<Peer> peer)
{
    // Map multiple ports from same IP
    auto ipPeers = ip2Peers(peer->ip());
    ipPeers.push_back((peer->port()));

    std::sort(ipPeers.begin(), ipPeers.end());
    ipPeers.erase(unique(ipPeers.begin(), ipPeers.end()), ipPeers.end());
    m_ip2PeerMap[peer->ip()] = ipPeers;
    m_p2pSocket->events()->onPeerConnect()->trigger(peer.get());

    m_peers[peer->name()] = std::move(peer);
    ++m_count;
}